

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

void Extra_ThreshSortByChow(word *t,int nVars,int *pChow)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  word wVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  ulong uVar8;
  byte bVar9;
  int t_1;
  int iVar10;
  word *pwVar11;
  uint *pLimitU;
  word *pwVar12;
  ulong uVar13;
  word *pwVar14;
  ulong uVar15;
  
  t_1._0_1_ = (char)nVars - 6;
  uVar5 = 1 << ((byte)t_1 & 0x1f);
  if (nVars < 7) {
    uVar5 = 1;
  }
  if (1 < nVars) {
    uVar8 = 0;
    bVar7 = false;
    do {
      do {
        iVar10 = pChow[uVar8];
        if (iVar10 < pChow[uVar8 + 1]) {
          pChow[uVar8] = pChow[uVar8 + 1];
          pChow[uVar8 + 1] = iVar10;
          bVar7 = true;
          if (uVar8 < 5) {
            if (0 < (int)uVar5) {
              uVar15 = s_PMasks[uVar8][0];
              uVar1 = s_PMasks[uVar8][1];
              uVar2 = s_PMasks[uVar8][2];
              uVar13 = 0;
              do {
                uVar3 = t[uVar13];
                bVar9 = (byte)(1 << ((byte)uVar8 & 0x1f));
                t[uVar13] = (uVar3 & uVar2) >> (bVar9 & 0x3f) |
                            (uVar3 & uVar1) << (bVar9 & 0x3f) | uVar3 & uVar15;
                uVar13 = uVar13 + 1;
              } while (uVar5 != uVar13);
            }
          }
          else if (uVar8 == 5) {
            pwVar11 = t;
            if (0 < (int)uVar5) {
              do {
                *(ulong *)((long)pwVar11 + 4) =
                     CONCAT44((int)*(undefined8 *)((long)pwVar11 + 4),
                              (int)((ulong)*(undefined8 *)((long)pwVar11 + 4) >> 0x20));
                pwVar11 = pwVar11 + 2;
              } while (pwVar11 < t + (int)uVar5);
            }
          }
          else if (0 < (int)uVar5) {
            uVar6 = 1 << ((byte)uVar8 - 6 & 0x1f);
            if (uVar8 < 7) {
              uVar6 = 1;
            }
            iVar10 = uVar6 * 4;
            pwVar11 = t + uVar6 * 2;
            pwVar14 = t + uVar6;
            pwVar12 = t;
            do {
              if (0 < (int)uVar6) {
                uVar15 = 0;
                do {
                  wVar4 = pwVar14[uVar15];
                  pwVar14[uVar15] = pwVar11[uVar15];
                  pwVar11[uVar15] = wVar4;
                  uVar15 = uVar15 + 1;
                } while (uVar6 != uVar15);
              }
              pwVar12 = pwVar12 + iVar10;
              pwVar11 = pwVar11 + iVar10;
              pwVar14 = pwVar14 + iVar10;
            } while (pwVar12 < t + (int)uVar5);
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != nVars - 1);
      if (!bVar7) {
        return;
      }
      uVar8 = 0;
      bVar7 = false;
    } while (1 < nVars);
  }
  return;
}

Assistant:

static inline int  Abc_TtWordNum( int nVars )     { return nVars <= 6 ? 1 : 1 << (nVars-6); }